

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

void __thiscall
duckdb::ParquetColumnSchema::ParquetColumnSchema
          (ParquetColumnSchema *this,ParquetColumnSchema *parent,LogicalType *result_type,
          ParquetColumnSchemaType schema_type)

{
  pointer pcVar1;
  idx_t iVar2;
  
  this->schema_type = schema_type;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (parent->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (parent->name)._M_string_length);
  duckdb::LogicalType::LogicalType(&this->type,result_type);
  iVar2 = parent->max_repeat;
  this->max_define = parent->max_define;
  this->max_repeat = iVar2;
  iVar2 = parent->column_index;
  this->schema_index = parent->schema_index;
  this->column_index = iVar2;
  (this->parent_schema_index).index = 0xffffffffffffffff;
  this->type_length = 0;
  this->type_scale = 0;
  this->parquet_type = INT32;
  *(undefined8 *)&this->type_info = 0;
  *(undefined8 *)
   ((long)&(this->children).
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->children).
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
  emplace_back<duckdb::ParquetColumnSchema>
            (&(this->children).
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ,parent);
  return;
}

Assistant:

ParquetColumnSchema::ParquetColumnSchema(ParquetColumnSchema parent, LogicalType result_type,
                                         ParquetColumnSchemaType schema_type)
    : schema_type(schema_type), name(parent.name), type(std::move(result_type)), max_define(parent.max_define),
      max_repeat(parent.max_repeat), schema_index(parent.schema_index), column_index(parent.column_index) {
	children.push_back(std::move(parent));
}